

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O1

void verifyTinySVD_4x4<double>(Matrix44<double> *A)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  int i;
  long lVar11;
  double *pdVar12;
  double (*padVar13) [4];
  int j;
  long lVar14;
  Matrix44 *pMVar15;
  int iVar16;
  bool bVar17;
  double dVar18;
  double dVar19;
  Matrix44<double> V;
  Matrix44<double> S_times_Vt;
  Vec4<double> S;
  Matrix44<double> U;
  double local_318;
  double dStack_310;
  double dStack_308;
  double local_300;
  double dStack_2f8;
  double local_2f0;
  double local_2e8;
  double dStack_2e0;
  double local_2d8;
  double dStack_2d0;
  double local_2c8;
  double local_2c0;
  double dStack_2b8;
  double local_2b0;
  double dStack_2a8;
  double local_2a0;
  double local_298;
  double dStack_290;
  double dStack_288;
  double local_280;
  double dStack_278;
  double local_270;
  double local_268;
  double dStack_260;
  double local_258;
  double dStack_250;
  double local_248;
  double dStack_240;
  double dStack_238;
  double local_230;
  double dStack_228;
  double local_220;
  double local_218;
  undefined8 uStack_210;
  double local_208;
  undefined8 uStack_200;
  double local_1f8;
  undefined8 uStack_1f0;
  double local_1e8;
  double dStack_1e0;
  Vec4 local_1d8 [8];
  double local_1d0 [3];
  Matrix44<double> local_1b8;
  double local_138;
  undefined8 uStack_130;
  double local_128;
  undefined8 uStack_120;
  double local_118;
  undefined8 uStack_110;
  double local_108;
  undefined8 uStack_100;
  double local_f8;
  undefined8 uStack_f0;
  double local_e8;
  undefined8 uStack_e0;
  double local_d8;
  undefined8 uStack_d0;
  double local_c8;
  undefined8 uStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  undefined1 local_58 [16];
  double local_48;
  double dStack_40;
  
  dVar18 = 0.0;
  lVar11 = 0;
  padVar13 = (double (*) [4])A;
  do {
    lVar14 = 0;
    dVar19 = dVar18;
    do {
      dVar18 = ABS((*(double (*) [4])*padVar13)[lVar14]);
      if (dVar18 <= dVar19) {
        dVar18 = dVar19;
      }
      lVar14 = lVar14 + 1;
      dVar19 = dVar18;
    } while (lVar14 != 4);
    lVar11 = lVar11 + 1;
    padVar13 = padVar13 + 1;
  } while (lVar11 != 4);
  local_128 = dVar18 * 100.0 * 2.220446049250313e-16;
  uStack_120 = 0;
  iVar16 = 0;
  do {
    local_1b8.x[0][0] = 1.0;
    local_1b8.x[0][3] = 0.0;
    local_1b8.x[1][0] = 0.0;
    local_1b8.x[0][1] = 0.0;
    local_1b8.x[0][2] = 0.0;
    local_1b8.x[1][1] = 1.0;
    local_1b8.x[2][0] = 0.0;
    local_1b8.x[2][1] = 0.0;
    local_1b8.x[1][2] = 0.0;
    local_1b8.x[1][3] = 0.0;
    local_1b8.x[2][2] = 1.0;
    local_1b8.x[3][1] = 0.0;
    local_1b8.x[3][2] = 0.0;
    local_1b8.x[2][3] = 0.0;
    local_1b8.x[3][0] = 0.0;
    local_1b8.x[3][3] = 1.0;
    local_318 = 1.0;
    local_300 = 0.0;
    dStack_2f8 = 0.0;
    dStack_310 = 0.0;
    dStack_308 = 0.0;
    local_2f0 = 1.0;
    local_2d8 = 0.0;
    dStack_2d0 = 0.0;
    local_2e8 = 0.0;
    dStack_2e0 = 0.0;
    local_2c8 = 1.0;
    local_2b0 = 0.0;
    dStack_2a8 = 0.0;
    local_2c0 = 0.0;
    dStack_2b8 = 0.0;
    local_2a0 = 1.0;
    Imath_3_2::jacobiSVD<double>
              ((Matrix44 *)A,(Matrix44 *)&local_1b8,local_1d8,(Matrix44 *)&local_318,
               2.220446049250313e-16,iVar16 == 0);
    local_298 = 1.0;
    local_280 = 0.0;
    dStack_278 = 0.0;
    dStack_290 = 0.0;
    dStack_288 = 0.0;
    local_270 = 1.0;
    local_258 = 0.0;
    dStack_250 = 0.0;
    local_268 = 0.0;
    dStack_260 = 0.0;
    local_248 = 1.0;
    local_230 = 0.0;
    dStack_228 = 0.0;
    dStack_240 = 0.0;
    dStack_238 = 0.0;
    local_220 = 1.0;
    pdVar12 = &local_298;
    lVar11 = 0;
    pMVar15 = (Matrix44 *)&local_318;
    do {
      lVar14 = 0;
      do {
        dVar18 = local_1d0[lVar14];
        dVar19 = *(double *)(pMVar15 + lVar14 * 8 + 8);
        pdVar12[lVar14] = *(double *)(pMVar15 + lVar14 * 8) * local_1d0[lVar14 + -1];
        (pdVar12 + lVar14)[1] = dVar19 * dVar18;
        dVar10 = dStack_228;
        dVar9 = local_230;
        dVar8 = dStack_238;
        dVar7 = dStack_240;
        dVar6 = dStack_250;
        dVar5 = local_258;
        dVar4 = dStack_260;
        dVar3 = local_268;
        dVar1 = dStack_278;
        dVar2 = local_280;
        dVar19 = dStack_288;
        dVar18 = dStack_290;
        lVar14 = lVar14 + 2;
      } while (lVar14 != 4);
      lVar11 = lVar11 + 1;
      pMVar15 = pMVar15 + 0x20;
      pdVar12 = pdVar12 + 4;
    } while (lVar11 != 4);
    dStack_290 = dStack_278;
    dStack_288 = local_258;
    local_280 = dStack_238;
    dStack_278 = dVar18;
    local_268 = dStack_250;
    dStack_260 = local_230;
    local_258 = dVar19;
    dStack_250 = dVar3;
    dStack_240 = dStack_228;
    dStack_238 = dVar2;
    local_230 = dVar4;
    dStack_228 = dVar7;
    local_c8 = local_1b8.x[0][1];
    uStack_c0 = 0;
    local_1e8 = local_1b8.x[0][0];
    dStack_1e0 = 0.0;
    local_d8 = local_1b8.x[0][2];
    uStack_d0 = 0;
    local_f8 = local_1b8.x[0][3];
    uStack_f0 = 0;
    local_b8 = local_1b8.x[0][3] * dVar2 +
               local_1b8.x[0][2] * dVar19 +
               local_1b8.x[0][0] * local_298 + local_1b8.x[0][1] * dVar18;
    dStack_b0 = local_1b8.x[0][3] * dVar4 +
                local_1b8.x[0][2] * dVar3 +
                local_1b8.x[0][0] * dVar1 + local_1b8.x[0][1] * local_270;
    local_a8 = local_1b8.x[0][3] * dVar7 +
               local_1b8.x[0][2] * local_248 + local_1b8.x[0][0] * dVar5 + local_1b8.x[0][1] * dVar6
    ;
    dStack_a0 = local_1b8.x[0][3] * local_220 +
                local_1b8.x[0][2] * dVar10 + local_1b8.x[0][0] * dVar8 + local_1b8.x[0][1] * dVar9;
    local_1f8 = local_1b8.x[1][1];
    uStack_1f0 = 0;
    local_e8 = local_1b8.x[1][0];
    uStack_e0 = 0;
    local_218 = local_1b8.x[1][2];
    uStack_210 = 0;
    local_108 = local_1b8.x[1][3];
    uStack_100 = 0;
    local_98 = local_1b8.x[1][3] * dVar2 +
               local_1b8.x[1][2] * dVar19 +
               local_1b8.x[1][0] * local_298 + dVar18 * local_1b8.x[1][1];
    dStack_90 = local_1b8.x[1][3] * dVar4 +
                local_1b8.x[1][2] * dVar3 +
                local_1b8.x[1][0] * dVar1 + local_270 * local_1b8.x[1][1];
    local_88 = local_1b8.x[1][3] * dVar7 +
               local_1b8.x[1][2] * local_248 + local_1b8.x[1][0] * dVar5 + local_1b8.x[1][1] * dVar6
    ;
    dStack_80 = local_1b8.x[1][3] * local_220 +
                local_1b8.x[1][2] * dVar10 + local_1b8.x[1][0] * dVar8 + local_1b8.x[1][1] * dVar9;
    local_208 = local_1b8.x[2][1];
    uStack_200 = 0;
    local_118 = local_1b8.x[2][3];
    uStack_110 = 0;
    local_78 = local_1b8.x[2][3] * dVar2 +
               local_1b8.x[2][2] * dVar19 +
               local_1b8.x[2][0] * local_298 + dVar18 * local_1b8.x[2][1];
    dStack_70 = local_1b8.x[2][3] * dVar4 +
                local_1b8.x[2][2] * dVar3 +
                local_1b8.x[2][0] * dVar1 + local_270 * local_1b8.x[2][1];
    local_68 = local_1b8.x[2][3] * dVar7 +
               local_1b8.x[2][2] * local_248 + local_1b8.x[2][0] * dVar5 + local_1b8.x[2][1] * dVar6
    ;
    dStack_60 = local_1b8.x[2][3] * local_220 +
                local_1b8.x[2][2] * dVar10 + local_1b8.x[2][0] * dVar8 + local_1b8.x[2][1] * dVar9;
    dVar1 = dVar4 * local_1b8.x[3][3] +
            dVar3 * local_1b8.x[3][2] + dVar1 * local_1b8.x[3][0] + local_270 * local_1b8.x[3][1];
    local_58._8_4_ = SUB84(dVar1,0);
    local_58._0_8_ =
         dVar2 * local_1b8.x[3][3] +
         dVar19 * local_1b8.x[3][2] + local_298 * local_1b8.x[3][0] + dVar18 * local_1b8.x[3][1];
    local_58._12_4_ = (int)((ulong)dVar1 >> 0x20);
    local_48 = local_1b8.x[3][3] * dVar7 +
               local_1b8.x[3][2] * local_248 + local_1b8.x[3][0] * dVar5 + local_1b8.x[3][1] * dVar6
    ;
    dStack_40 = local_1b8.x[3][3] * local_220 +
                local_1b8.x[3][2] * dVar10 + local_1b8.x[3][0] * dVar8 + local_1b8.x[3][1] * dVar9;
    pdVar12 = &local_b8;
    lVar11 = 0;
    padVar13 = (double (*) [4])A;
    do {
      lVar14 = 0;
      do {
        if (local_128 < ABS(pdVar12[lVar14] - (*(double (*) [4])*padVar13)[lVar14])) {
          __assert_fail("std::abs (product[i][j] - A[i][j]) <= valueEps",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                        ,0x8b,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = double]")
          ;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
      lVar11 = lVar11 + 1;
      padVar13 = padVar13 + 1;
      pdVar12 = pdVar12 + 4;
    } while (lVar11 != 4);
    if (iVar16 == 0) {
      local_138 = local_1b8.x[3][3];
      uStack_130 = 0;
      dVar18 = 0.0;
      if ((local_1b8.x[0][3] != 0.0) || (NAN(local_1b8.x[0][3]))) {
        dVar18 = 0.0 - local_1b8.x[0][3] *
                       ((local_1b8.x[2][0] * local_1b8.x[3][1] -
                        local_1b8.x[3][0] * local_1b8.x[2][1]) * local_1b8.x[1][2] +
                       (local_1b8.x[2][1] * local_1b8.x[3][2] -
                       local_1b8.x[3][1] * local_1b8.x[2][2]) * local_1b8.x[1][0] +
                       (local_1b8.x[2][2] * local_1b8.x[3][0] -
                       local_1b8.x[3][2] * local_1b8.x[2][0]) * local_1b8.x[1][1]);
      }
      if ((local_1b8.x[1][3] != 0.0) || (NAN(local_1b8.x[1][3]))) {
        dVar18 = dVar18 + local_1b8.x[1][3] *
                          ((local_1b8.x[2][0] * local_1b8.x[3][1] -
                           local_1b8.x[3][0] * local_1b8.x[2][1]) * local_1b8.x[0][2] +
                          (local_1b8.x[2][1] * local_1b8.x[3][2] -
                          local_1b8.x[3][1] * local_1b8.x[2][2]) * local_1b8.x[0][0] +
                          (local_1b8.x[2][2] * local_1b8.x[3][0] -
                          local_1b8.x[3][2] * local_1b8.x[2][0]) * local_1b8.x[0][1]);
      }
      if ((local_1b8.x[2][3] != 0.0) || (NAN(local_1b8.x[2][3]))) {
        dVar18 = dVar18 - local_1b8.x[2][3] *
                          ((local_1b8.x[1][0] * local_1b8.x[3][1] -
                           local_1b8.x[3][0] * local_1b8.x[1][1]) * local_1b8.x[0][2] +
                          (local_1b8.x[1][1] * local_1b8.x[3][2] -
                          local_1b8.x[3][1] * local_1b8.x[1][2]) * local_1b8.x[0][0] +
                          (local_1b8.x[1][2] * local_1b8.x[3][0] -
                          local_1b8.x[3][2] * local_1b8.x[1][0]) * local_1b8.x[0][1]);
      }
      if ((local_1b8.x[3][3] != 0.0) || (NAN(local_1b8.x[3][3]))) {
        dVar18 = dVar18 + local_1b8.x[3][3] *
                          (local_1b8.x[0][2] *
                           (local_1b8.x[1][0] * local_1b8.x[2][1] -
                           local_1b8.x[2][0] * local_1b8.x[1][1]) +
                          local_1b8.x[0][0] *
                          (local_1b8.x[1][1] * local_1b8.x[2][2] -
                          local_1b8.x[2][1] * local_1b8.x[1][2]) +
                          local_1b8.x[0][1] *
                          (local_1b8.x[1][2] * local_1b8.x[2][0] -
                          local_1b8.x[2][2] * local_1b8.x[1][0]));
      }
      if (dVar18 <= 0.99) {
        __assert_fail("U.determinant () > 0.99",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x90,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = double]");
      }
      dVar18 = 0.0;
      if ((local_300 != 0.0) || (NAN(local_300))) {
        dVar18 = 0.0 - local_300 *
                       ((local_2d8 * local_2b0 - dStack_2b8 * dStack_2d0) * local_2e8 +
                       (dStack_2d0 * dStack_2a8 - local_2b0 * local_2c8) * dStack_2f8 +
                       (local_2c8 * dStack_2b8 - dStack_2a8 * local_2d8) * local_2f0);
      }
      if ((dStack_2e0 != 0.0) || (NAN(dStack_2e0))) {
        dVar18 = dVar18 + dStack_2e0 *
                          ((local_2d8 * local_2b0 - dStack_2b8 * dStack_2d0) * dStack_308 +
                          (dStack_2d0 * dStack_2a8 - local_2b0 * local_2c8) * local_318 +
                          (local_2c8 * dStack_2b8 - dStack_2a8 * local_2d8) * dStack_310);
      }
      if ((local_2c0 != 0.0) || (NAN(local_2c0))) {
        dVar18 = dVar18 - local_2c0 *
                          ((dStack_2f8 * local_2b0 - dStack_2b8 * local_2f0) * dStack_308 +
                          (local_2f0 * dStack_2a8 - local_2b0 * local_2e8) * local_318 +
                          (local_2e8 * dStack_2b8 - dStack_2a8 * dStack_2f8) * dStack_310);
      }
      if ((local_2a0 != 0.0) || (NAN(local_2a0))) {
        dVar18 = dVar18 + local_2a0 *
                          ((dStack_2f8 * dStack_2d0 - local_2d8 * local_2f0) * dStack_308 +
                          (local_2f0 * local_2c8 - dStack_2d0 * local_2e8) * local_318 +
                          (local_2e8 * local_2d8 - local_2c8 * dStack_2f8) * dStack_310);
      }
      if (dVar18 <= 0.99) {
        __assert_fail("V.determinant () > 0.99",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x91,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = double]");
      }
    }
    lVar11 = 1;
    while (lVar11 != 4) {
      pdVar12 = &dStack_1e0 + lVar11;
      lVar14 = lVar11 + -1;
      lVar11 = lVar11 + 1;
      if (*pdVar12 < local_1d0[lVar14]) {
        __assert_fail("S[i] >= S[i + 1]",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x96,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = double]");
      }
    }
    lVar11 = 0;
    do {
      if (local_1d0[lVar11 + -1] < 0.0) {
        __assert_fail("S[i] >= T (0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x9a,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = double]");
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    if ((iVar16 != 0) && (local_1d0[2] < 0.0)) {
      __assert_fail("S[3] >= T (0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                    ,0x9c,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = double]");
    }
    verifyOrthonormal<double>(&local_1b8);
    verifyOrthonormal<double>((Matrix44<double> *)&local_318);
    bVar17 = iVar16 != 0;
    iVar16 = iVar16 + 1;
    if (bVar17) {
      return;
    }
  } while( true );
}

Assistant:

void
verifyTinySVD_4x4 (const IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A)
{
    T maxEntry = 0;
    for (int i = 0; i < 4; ++i)
        for (int j = 0; j < 4; ++j)
            maxEntry = std::max (maxEntry, std::abs (A[i][j]));

    const T eps      = std::numeric_limits<T>::epsilon ();
    const T valueEps = maxEntry * T (100) * eps;

    for (int i = 0; i < 2; ++i)
    {
        const bool posDet = (i == 0);

        IMATH_INTERNAL_NAMESPACE::Matrix44<T> U, V;
        IMATH_INTERNAL_NAMESPACE::Vec4<T>     S;
        IMATH_INTERNAL_NAMESPACE::jacobiSVD (A, U, S, V, eps, posDet);

        IMATH_INTERNAL_NAMESPACE::Matrix44<T> S_times_Vt;
        for (int i = 0; i < 4; ++i)
            for (int j = 0; j < 4; ++j)
                S_times_Vt[i][j] = S[j] * V[i][j];
        S_times_Vt.transpose ();

        // Verify that the product of the matrices is A:
        const IMATH_INTERNAL_NAMESPACE::Matrix44<T> product = U * S_times_Vt;
        for (int i = 0; i < 4; ++i)
            for (int j = 0; j < 4; ++j)
                assert (std::abs (product[i][j] - A[i][j]) <= valueEps);

        // Verify that U and V have positive determinant if requested:
        if (posDet)
        {
            assert (U.determinant () > 0.99);
            assert (V.determinant () > 0.99);
        }

        // Verify that the singular values are sorted:
        for (int i = 0; i < 3; ++i)
            assert (S[i] >= S[i + 1]);

        // Verify that all the SVs except maybe the last one are positive:
        for (int i = 0; i < 3; ++i)
            assert (S[i] >= T (0));

        if (!posDet) assert (S[3] >= T (0));

        verifyOrthonormal (U);
        verifyOrthonormal (V);
    }
}